

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

error_code __thiscall
cinatra::coro_http_client::handle_header
          (coro_http_client *this,resp_data *data,http_parser *parser,size_t header_size)

{
  int iVar1;
  char *data_00;
  int64_t iVar2;
  cerr_logger_t *this_00;
  size_t n;
  http_parser *in_RCX;
  http_parser *in_RDX;
  long in_RSI;
  basic_streambuf<std::allocator<char>_> *in_RDI;
  const_buffers_type cVar3;
  error_code eVar4;
  span<cinatra::http_header,_18446744073709551615UL> sVar5;
  int parse_ret;
  char *data_ptr;
  char (*in_stack_ffffffffffffff68) [30];
  http_parser *in_stack_ffffffffffffff70;
  pointer local_78;
  __extent_storage<18446744073709551615UL> local_70;
  size_t in_stack_ffffffffffffff98;
  basic_streambuf<std::allocator<char>_> *in_stack_ffffffffffffffa0;
  undefined1 auVar6 [12];
  uint local_10;
  error_category *local_8;
  
  cVar3 = asio::basic_streambuf<std::allocator<char>_>::data(in_stack_ffffffffffffffa0);
  auVar6 = cVar3.super_const_buffer._4_12_;
  data_00 = asio::buffer_cast<char_const*>((const_buffer *)0x2bb1ab);
  iVar1 = http_parser::parse_response(in_RCX,data_00,auVar6._4_8_,auVar6._0_4_);
  if (iVar1 < 0) {
    asio::basic_streambuf<std::allocator<char>_>::size(in_RDI);
    asio::basic_streambuf<std::allocator<char>_>::consume
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    eVar4 = std::make_error_code(0);
    local_8 = eVar4._M_cat;
    local_10 = eVar4._M_value;
  }
  else {
    iVar2 = http_parser::body_len((http_parser *)&in_RDI->field_0x10);
    if (iVar2 <= *(long *)&in_RDI[0x2d].field_0x38) {
      iVar2 = http_parser::body_len((http_parser *)&in_RDI->field_0x10);
      if (-1 < iVar2) {
        asio::basic_streambuf<std::allocator<char>_>::consume
                  (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        sVar5 = http_parser::get_headers(in_stack_ffffffffffffff70);
        local_78 = sVar5._M_ptr;
        *(pointer *)(in_RSI + 0x28) = local_78;
        local_70 = sVar5._M_extent._M_extent_value;
        *(size_t *)(in_RSI + 0x30) = local_70._M_extent_value;
        iVar1 = http_parser::status(in_RDX);
        *(int *)(in_RSI + 0x10) = iVar1;
        std::error_code::error_code((error_code *)in_stack_ffffffffffffff70);
        goto LAB_002bb352;
      }
    }
    this_00 = cerr_logger_t::operator<<
                        ((cerr_logger_t *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    n = http_parser::body_len((http_parser *)&in_RDI->field_0x10);
    cerr_logger_t::operator<<(this_00,(long *)in_stack_ffffffffffffff68);
    cerr_logger_t::~cerr_logger_t((cerr_logger_t *)0x2bb293);
    asio::basic_streambuf<std::allocator<char>_>::size(in_RDI);
    asio::basic_streambuf<std::allocator<char>_>::consume(in_stack_ffffffffffffffa0,n);
    eVar4 = std::make_error_code(0);
    local_8 = eVar4._M_cat;
    local_10 = eVar4._M_value;
  }
LAB_002bb352:
  eVar4._4_4_ = 0;
  eVar4._M_value = local_10;
  eVar4._M_cat = local_8;
  return eVar4;
}

Assistant:

std::error_code handle_header(resp_data &data, http_parser &parser,
                                size_t header_size) {
    // parse header
    const char *data_ptr = asio::buffer_cast<const char *>(head_buf_.data());

    int parse_ret = parser.parse_response(data_ptr, header_size, 0);
#ifdef INJECT_FOR_HTTP_CLIENT_TEST
    if (parse_failed_forever_) {
      parse_ret = -1;
    }
#endif
    if (parse_ret < 0) [[unlikely]] {
      head_buf_.consume(head_buf_.size());
      return std::make_error_code(std::errc::protocol_error);
    }

    if (parser_.body_len() > max_http_body_len_ || parser_.body_len() < 0)
        [[unlikely]] {
      CINATRA_LOG_ERROR << "invalid http content length: "
                        << parser_.body_len();
      head_buf_.consume(head_buf_.size());
      return std::make_error_code(std::errc::invalid_argument);
    }

    head_buf_.consume(header_size);  // header size
    data.resp_headers = parser.get_headers();
    data.status = parser.status();
    return {};
  }